

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lossless_sse2.c
# Opt level: O2

void PredictorAdd0_SSE2(uint32_t *in,uint32_t *upper,int num_pixels,uint32_t *out)

{
  uint32_t *puVar1;
  uint32_t *puVar2;
  char cVar3;
  char cVar4;
  char cVar5;
  char cVar6;
  char cVar7;
  char cVar8;
  char cVar9;
  char cVar10;
  char cVar11;
  char cVar12;
  char cVar13;
  char cVar14;
  uint32_t uVar15;
  uint32_t uVar16;
  uint32_t uVar17;
  undefined1 auVar18 [16];
  long lVar19;
  long lVar20;
  
  auVar18 = _DAT_001a4af0;
  lVar19 = 0;
  lVar20 = 0;
  while (lVar20 + 4 <= (long)num_pixels) {
    puVar1 = in + lVar20;
    cVar3 = *(char *)((long)puVar1 + 1);
    cVar4 = *(char *)((long)puVar1 + 2);
    cVar5 = *(char *)((long)puVar1 + 3);
    uVar15 = puVar1[1];
    cVar6 = *(char *)((long)puVar1 + 5);
    cVar7 = *(char *)((long)puVar1 + 6);
    cVar8 = *(char *)((long)puVar1 + 7);
    uVar16 = puVar1[2];
    cVar9 = *(char *)((long)puVar1 + 9);
    cVar10 = *(char *)((long)puVar1 + 10);
    cVar11 = *(char *)((long)puVar1 + 0xb);
    uVar17 = puVar1[3];
    cVar12 = *(char *)((long)puVar1 + 0xd);
    cVar13 = *(char *)((long)puVar1 + 0xe);
    cVar14 = *(char *)((long)puVar1 + 0xf);
    puVar2 = out + lVar20;
    *(char *)puVar2 = (char)*puVar1 + auVar18[0];
    *(char *)((long)puVar2 + 1) = cVar3 + auVar18[1];
    *(char *)((long)puVar2 + 2) = cVar4 + auVar18[2];
    *(char *)((long)puVar2 + 3) = cVar5 + auVar18[3];
    *(char *)(puVar2 + 1) = (char)uVar15 + auVar18[4];
    *(char *)((long)puVar2 + 5) = cVar6 + auVar18[5];
    *(char *)((long)puVar2 + 6) = cVar7 + auVar18[6];
    *(char *)((long)puVar2 + 7) = cVar8 + auVar18[7];
    *(char *)(puVar2 + 2) = (char)uVar16 + auVar18[8];
    *(char *)((long)puVar2 + 9) = cVar9 + auVar18[9];
    *(char *)((long)puVar2 + 10) = cVar10 + auVar18[10];
    *(char *)((long)puVar2 + 0xb) = cVar11 + auVar18[0xb];
    *(char *)(puVar2 + 3) = (char)uVar17 + auVar18[0xc];
    *(char *)((long)puVar2 + 0xd) = cVar12 + auVar18[0xd];
    *(char *)((long)puVar2 + 0xe) = cVar13 + auVar18[0xe];
    *(char *)((long)puVar2 + 0xf) = cVar14 + auVar18[0xf];
    lVar19 = lVar19 + -0x10;
    lVar20 = lVar20 + 4;
  }
  if (num_pixels == (int)lVar20) {
    return;
  }
  (*VP8LPredictorsAdd_C[0])
            ((uint32_t *)((long)in - lVar19),(uint32_t *)0x0,num_pixels - (int)lVar20,
             (uint32_t *)((long)out - lVar19));
  return;
}

Assistant:

static void PredictorAdd0_SSE2(const uint32_t* in, const uint32_t* upper,
                               int num_pixels, uint32_t* WEBP_RESTRICT out) {
  int i;
  const __m128i black = _mm_set1_epi32((int)ARGB_BLACK);
  for (i = 0; i + 4 <= num_pixels; i += 4) {
    const __m128i src = _mm_loadu_si128((const __m128i*)&in[i]);
    const __m128i res = _mm_add_epi8(src, black);
    _mm_storeu_si128((__m128i*)&out[i], res);
  }
  if (i != num_pixels) {
    VP8LPredictorsAdd_C[0](in + i, NULL, num_pixels - i, out + i);
  }
  (void)upper;
}